

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O3

int __thiscall YAML::RegEx::MatchOpAnd<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  int iVar1;
  int iVar2;
  pointer pRVar3;
  ulong uVar4;
  long lVar5;
  
  pRVar3 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
      super__Vector_impl_data._M_finish == pRVar3) {
LAB_00713da8:
    iVar2 = -1;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    iVar2 = -1;
    do {
      iVar1 = MatchUnchecked<YAML::StreamCharSource>((RegEx *)((long)&pRVar3->m_op + lVar5),source);
      if (iVar1 == -1) goto LAB_00713da8;
      if (uVar4 == 0) {
        iVar2 = iVar1;
      }
      uVar4 = uVar4 + 1;
      pRVar3 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < (ulong)((long)(this->m_params).
                                   super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 5));
  }
  return iVar2;
}

Assistant:

inline int RegEx::MatchOpAnd(const Source& source) const {
  int first = -1;
  for (std::size_t i = 0; i < m_params.size(); i++) {
    int n = m_params[i].MatchUnchecked(source);
    if (n == -1)
      return -1;
    if (i == 0)
      first = n;
  }
  return first;
}